

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O0

void merge(int n,uint32_t *x,int step)

{
  undefined4 in_EDX;
  uint32_t *in_RSI;
  int in_EDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  if (in_EDI == 1) {
    minmax(in_RSI,(uint32_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  else {
    merge((int)((ulong)in_RSI >> 0x20),(uint32_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    merge((int)((ulong)in_RSI >> 0x20),(uint32_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    for (iVar1 = 1; iVar1 < in_EDI * 2 + -1; iVar1 = iVar1 + 2) {
      minmax(in_RSI,(uint32_t *)CONCAT44(in_EDX,iVar1));
    }
  }
  return;
}

Assistant:

static void merge(int n,uint32_t x[n],int step)
{
  int i;
  if (n == 1)
    minmax(&x[0],&x[step]);
  else {
    merge(n / 2,x,step * 2);
    merge(n / 2,x + step,step * 2);
    for (i = 1;i < 2*n-1;i += 2)
      minmax(&x[i * step],&x[(i + 1) * step]);
  }
}